

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

ndicapi * ndiOpenSerial(char *device)

{
  int serial_port_00;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  ndicapi *pol;
  NDIFileHandle serial_port;
  char *device_local;
  
  serial_port_00 = ndiSerialOpen(device);
  if (serial_port_00 == -1) {
    device_local = (char *)0x0;
  }
  else {
    iVar1 = ndiSerialComm(serial_port_00,0x2580,"8N1",0);
    if (iVar1 < 0) {
      ndiSerialClose(serial_port_00);
      device_local = (char *)0x0;
    }
    else {
      iVar1 = ndiSerialFlush(serial_port_00,3);
      if (iVar1 < 0) {
        ndiSerialClose(serial_port_00);
        device_local = (char *)0x0;
      }
      else {
        device_local = (char *)malloc(0x65b8);
        if ((int *)device_local == (int *)0x0) {
          ndiSerialClose(serial_port_00);
          device_local = (char *)0x0;
        }
        else {
          memset(device_local,0,0x65b8);
          *(int *)device_local = serial_port_00;
          sVar2 = strlen(device);
          pvVar3 = malloc(sVar2 + 1);
          *(void **)((long)device_local + 8) = pvVar3;
          pvVar3 = malloc(0x800);
          *(void **)((long)device_local + 0x28) = pvVar3;
          pvVar3 = malloc(0x800);
          *(void **)((long)device_local + 0x30) = pvVar3;
          pvVar3 = malloc(0x800);
          *(void **)((long)device_local + 0x80) = pvVar3;
          *(int *)((long)device_local + 0x18) = 0;
          *(int *)((long)device_local + 0x1c) = 0;
          *(int *)((long)device_local + 0x20) = -1;
          *(int *)((long)device_local + 0x10) = -1;
          if ((((*(long *)((long)device_local + 8) == 0) ||
               (*(long *)((long)device_local + 0x28) == 0)) ||
              (*(long *)((long)device_local + 0x30) == 0)) ||
             (*(long *)((long)device_local + 0x80) == 0)) {
            if (*(long *)((long)device_local + 8) != 0) {
              free(*(void **)((long)device_local + 8));
            }
            if (*(long *)((long)device_local + 0x28) != 0) {
              free(*(void **)((long)device_local + 0x28));
            }
            if (*(long *)((long)device_local + 0x30) != 0) {
              free(*(void **)((long)device_local + 0x30));
            }
            if (*(long *)((long)device_local + 0x80) != 0) {
              free(*(void **)((long)device_local + 0x80));
            }
            ndiSerialClose(serial_port_00);
            device_local = (char *)0x0;
          }
          else {
            strcpy(*(char **)((long)device_local + 8),device);
            memset(*(void **)((long)device_local + 0x28),0,0x800);
            memset(*(void **)((long)device_local + 0x30),0,0x800);
            memset(*(void **)((long)device_local + 0x80),0,0x800);
          }
        }
      }
    }
  }
  return (ndicapi *)device_local;
}

Assistant:

ndicapiExport ndicapi* ndiOpenSerial(const char* device)
{
  NDIFileHandle serial_port;
  ndicapi* pol;

  serial_port = ndiSerialOpen(device);

  if (serial_port == NDI_INVALID_HANDLE)
  {
    return NULL;
  }

  if (ndiSerialComm(serial_port, 9600, "8N1", 0) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  if (ndiSerialFlush(serial_port, NDI_IOFLUSH) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  pol = (ndicapi*)malloc(sizeof(ndicapi));

  if (pol == 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  memset(pol, 0, sizeof(ndicapi));
  pol->SerialDevice = serial_port;

  // allocate the buffers
  pol->SerialDeviceName = (char*)malloc(strlen(device) + 1);
  pol->Command = (char*)malloc(2048);
  pol->Reply = (char*)malloc(2048);
  pol->ReplyNoCRC = (char*)malloc(2048);
  pol->Hostname = NULL;
  pol->Port = -1;
  pol->Socket = -1;

  if (pol->SerialDeviceName == 0 || pol->Command == 0 || pol->Reply == 0 || pol->ReplyNoCRC == 0)
  {
    if (pol->SerialDeviceName)
    {
      free(pol->SerialDeviceName);
    }
    if (pol->Command)
    {
      free(pol->Command);
    }
    if (pol->Reply)
    {
      free(pol->Reply);
    }
    if (pol->ReplyNoCRC)
    {
      free(pol->ReplyNoCRC);
    }

    ndiSerialClose(serial_port);
    return NULL;
  }

  // initialize the allocated memory
  strcpy(pol->SerialDeviceName, device);
  memset(pol->Command, 0, 2048);
  memset(pol->Reply, 0, 2048);
  memset(pol->ReplyNoCRC, 0, 2048);

  return pol;
}